

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

Relations __thiscall dg::vr::ValueRelations::_between(ValueRelations *this,Handle lt,C cRt)

{
  uint uVar1;
  bitset<12UL> bVar2;
  long lVar3;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> pVar4;
  Relations relsBound;
  _Base_bitset<1UL> local_50;
  uint local_48 [6];
  
  if (cRt == (C)0x0) {
    return (Relations)0;
  }
  local_48[0] = 2;
  local_48[1] = 4;
  local_48[2] = 6;
  local_48[3] = 8;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x10) {
      return (Relations)0;
    }
    uVar1 = *(uint *)((long)local_48 + lVar3);
    relsBound.bits.super__Base_bitset<1UL>._M_w = (bitset<12UL>)(_Base_bitset<1UL>)0x0;
    std::bitset<12UL>::set(&relsBound.bits,(ulong)uVar1,true);
    pVar4 = getBound(this,lt,relsBound);
    local_50._M_w = (_WordT)pVar4.second.bits.super__Base_bitset<1UL>._M_w;
    if ((pVar4.first != (C)0x0) &&
       (relsBound = compare(pVar4.first,cRt),
       ((ulong)relsBound.bits.super__Base_bitset<1UL>._M_w >> ((ulong)uVar1 & 0x3f) & 1) != 0))
    break;
    lVar3 = lVar3 + 4;
  }
  bVar2.super__Base_bitset<1UL>._M_w =
       (_Base_bitset<1UL>)dg::vr::compose((Relations *)&local_50,&relsBound);
  return (Relations)(_WordT)bVar2.super__Base_bitset<1UL>._M_w;
}

Assistant:

Relations ValueRelations::_between(Handle lt, C cRt) const {
    if (!cRt)
        return {};

    for (Relations::Type rel :
         {Relations::SLE, Relations::ULE, Relations::SGE, Relations::UGE}) {
        C boundLt;
        Relations relsLt;
        std::tie(boundLt, relsLt) = getBound(lt, Relations().set(rel));

        if (!boundLt)
            continue;

        Relations relsBound = compare(boundLt, cRt);
        // lt <= boundLt <= cRt || lt >= boundLt >= cRt
        if (relsBound.has(rel))
            return compose(relsLt, relsBound);
    }
    return {};
}